

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::vSolveLright2
          (CLUFactor<double> *this,double *vec,int *ridx,int *rn,double eps,double *vec2,int *ridx2,
          int *rn2,double eps2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  pdVar4 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->l).idx;
  piVar6 = (this->l).row;
  uVar1 = (this->l).firstUpdate;
  uVar10 = 0;
  uVar12 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar12 = uVar10;
  }
  piVar7 = (this->l).start;
  for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
    iVar2 = piVar6[uVar10];
    dVar14 = vec2[iVar2];
    dVar13 = vec[iVar2];
    if (ABS(dVar13) <= eps) {
      if (eps2 < ABS(dVar14)) {
        iVar2 = piVar7[uVar10];
        lVar8 = (long)iVar2 << 2;
        for (iVar9 = piVar7[uVar10 + 1]; iVar2 < iVar9; iVar9 = iVar9 + -1) {
          iVar3 = *(int *)((long)piVar5 + lVar8);
          dVar13 = *(double *)((long)pdVar4 + lVar8 * 2);
          dVar15 = vec2[iVar3];
          if ((dVar15 == 0.0) && (!NAN(dVar15))) {
            ridx2[*rn2] = iVar3;
            *rn2 = *rn2 + 1;
          }
          dVar15 = dVar15 - dVar13 * dVar14;
          uVar11 = -(ulong)(dVar15 == 0.0);
          vec2[iVar3] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar15);
          lVar8 = lVar8 + 4;
        }
      }
    }
    else {
      iVar2 = piVar7[uVar10];
      iVar9 = piVar7[uVar10 + 1];
      if (ABS(dVar14) <= eps2) {
        lVar8 = (long)iVar2 * 4;
        for (; iVar2 < iVar9; iVar9 = iVar9 + -1) {
          iVar3 = *(int *)((long)piVar5 + lVar8);
          dVar14 = *(double *)((long)pdVar4 + lVar8 * 2);
          dVar15 = vec[iVar3];
          if ((dVar15 == 0.0) && (!NAN(dVar15))) {
            ridx[*rn] = iVar3;
            *rn = *rn + 1;
          }
          dVar15 = dVar15 - dVar14 * dVar13;
          uVar11 = -(ulong)(dVar15 == 0.0);
          vec[iVar3] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar15);
          lVar8 = lVar8 + 4;
        }
      }
      else {
        lVar8 = (long)iVar2 * 4;
        for (; iVar2 < iVar9; iVar9 = iVar9 + -1) {
          iVar3 = *(int *)((long)piVar5 + lVar8);
          dVar15 = *(double *)((long)pdVar4 + lVar8 * 2);
          dVar16 = vec[iVar3];
          if ((dVar16 == 0.0) && (!NAN(dVar16))) {
            ridx[*rn] = iVar3;
            *rn = *rn + 1;
          }
          dVar16 = dVar16 - dVar15 * dVar13;
          uVar11 = -(ulong)(dVar16 == 0.0);
          vec[iVar3] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar16);
          dVar15 = *(double *)((long)pdVar4 + lVar8 * 2);
          dVar16 = vec2[iVar3];
          if ((dVar16 == 0.0) && (!NAN(dVar16))) {
            ridx2[*rn2] = iVar3;
            *rn2 = *rn2 + 1;
          }
          dVar16 = dVar16 - dVar15 * dVar14;
          uVar11 = -(ulong)(dVar16 == 0.0);
          vec2[iVar3] = (double)(uVar11 & 0x2b2bff2ee48e0530 | ~uVar11 & (ulong)dVar16);
          lVar8 = lVar8 + 4;
        }
      }
    }
  }
  if ((this->l).updateType != 0) {
    iVar2 = (this->l).firstUnused;
    while ((long)uVar12 < (long)iVar2) {
      uVar10 = uVar12 + 1;
      lVar8 = (long)piVar7[uVar12] << 2;
      dVar16 = 0.0;
      dVar15 = 0.0;
      dVar14 = 0.0;
      dVar13 = 0.0;
      for (iVar9 = piVar7[uVar12 + 1]; piVar7[uVar12] < iVar9; iVar9 = iVar9 + -1) {
        dVar18 = *(double *)((long)pdVar4 + lVar8 * 2);
        dVar19 = vec[*(int *)((long)piVar5 + lVar8)] * dVar18;
        dVar17 = dVar14 + dVar19;
        dVar16 = dVar16 + (dVar19 - (dVar17 - dVar14)) + (dVar14 - (dVar17 - (dVar17 - dVar14)));
        dVar18 = dVar18 * vec2[*(int *)((long)piVar5 + lVar8)];
        dVar19 = dVar13 + dVar18;
        dVar15 = dVar15 + (dVar18 - (dVar19 - dVar13)) + (dVar13 - (dVar19 - (dVar19 - dVar13)));
        lVar8 = lVar8 + 4;
        dVar14 = dVar17;
        dVar13 = dVar19;
      }
      iVar9 = piVar6[uVar12];
      if (eps < ABS(dVar14 + dVar16)) {
        dVar18 = vec[iVar9];
        if ((dVar18 == 0.0) && (!NAN(dVar18))) {
          ridx[*rn] = iVar9;
          *rn = *rn + 1;
        }
        dVar18 = dVar18 - (dVar14 + dVar16);
        uVar12 = -(ulong)(dVar18 == 0.0);
        vec[iVar9] = (double)(uVar12 & 0x2b2bff2ee48e0530 | ~uVar12 & (ulong)dVar18);
      }
      uVar12 = uVar10;
      if (eps2 < ABS(dVar13 + dVar15)) {
        dVar14 = vec2[iVar9];
        if ((dVar14 == 0.0) && (!NAN(dVar14))) {
          ridx2[*rn2] = iVar9;
          *rn2 = *rn2 + 1;
        }
        dVar14 = dVar14 - (dVar13 + dVar15);
        uVar10 = -(ulong)(dVar14 == 0.0);
        vec2[iVar9] = (double)(uVar10 & 0x2b2bff2ee48e0530 | ~uVar10 & (ulong)dVar14);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}